

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

void TMS320C64x_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *in_RDI;
  
  MCRegisterInfo_InitMCRegisterInfo
            (in_RDI,TMS320C64xRegDesc,0x5a,0,0,TMS320C64xMCRegisterClasses,7,(uint16_t (*) [2])0x0,0
             ,TMS320C64xRegDiffLists,(char *)0x0,TMS320C64xSubRegIdxLists,1,(uint16_t *)0x0);
  return;
}

Assistant:

void TMS320C64x_init(MCRegisterInfo *MRI)
{
	MCRegisterInfo_InitMCRegisterInfo(MRI, TMS320C64xRegDesc, 90,
			0, 0,
			TMS320C64xMCRegisterClasses, 7,
			0, 0,
			TMS320C64xRegDiffLists,
			0,
			TMS320C64xSubRegIdxLists, 1,
			0);
}